

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Vec3fa __thiscall embree::cartesian(embree *this,float phi,float cosTheta)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  Vec3fa VVar5;
  
  fVar4 = 1.0 - cosTheta * cosTheta;
  if (fVar4 <= 0.0) {
    fVar4 = 0.0;
  }
  fVar2 = sinf(phi);
  fVar3 = cosf(phi);
  VVar5.field_0._0_4_ = fVar3 * SQRT(fVar4);
  VVar5.field_0._4_4_ = fVar2 * SQRT(fVar4);
  auVar1._4_4_ = VVar5.field_0._4_4_;
  auVar1._0_4_ = VVar5.field_0._0_4_;
  auVar1._8_4_ = cosTheta;
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])this = auVar1;
  VVar5.field_0._8_8_ = 0;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

inline Vec3fa cartesian(const float phi, const float cosTheta)
{
  return cartesian(phi, cos2sin(cosTheta), cosTheta);
}